

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O1

void shutdown_connection(uv_prepare_t *prepare)

{
  long *plVar1;
  int iVar2;
  
  plVar1 = (long *)prepare->data;
  iVar2 = uv_is_closing((uv_handle_t *)prepare);
  if (iVar2 == 0) {
    uv_close((uv_handle_t *)prepare,cmEventBasedConnection::on_close_delete<uv_prepare_s>);
  }
  (**(code **)(*plVar1 + 0x50))(plVar1,0);
  return;
}

Assistant:

void shutdown_connection(uv_prepare_t* prepare)
{
  cmStdIoConnection* connection =
    reinterpret_cast<cmStdIoConnection*>(prepare->data);

  if (!uv_is_closing(reinterpret_cast<uv_handle_t*>(prepare))) {
    uv_close(reinterpret_cast<uv_handle_t*>(prepare),
             &cmEventBasedConnection::on_close_delete<uv_prepare_t>);
  }
  connection->OnDisconnect(0);
}